

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O2

int CVmObjList::getp_remove_range(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  if ((getp_remove_range(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_remove_range(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    getp_remove_range::desc.min_argc_ = 2;
    getp_remove_range::desc.opt_argc_ = 0;
    getp_remove_range::desc.varargs_ = 0;
    __cxa_guard_release(&getp_remove_range(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                         desc);
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_remove_range::desc);
  if (iVar1 != 0) {
    return 1;
  }
  uVar2 = CVmBif::pop_int_val();
  uVar3 = CVmBif::pop_int_val();
  if ((int)uVar2 < 0) {
    uVar2 = uVar2 + *(ushort *)lst + 1;
  }
  if ((int)uVar3 < 0) {
    uVar3 = uVar3 + *(ushort *)lst + 1;
  }
  if ((0 < (int)uVar2) && (0 < (int)uVar3)) {
    if ((uVar2 - 1 < (uint)*(ushort *)lst) &&
       ((uVar2 <= uVar3 && (uVar3 - 1 < (uint)*(ushort *)lst)))) {
      remove_range(retval,self_val,lst,uVar2 - 1,(uVar3 - uVar2) + 1);
      return 1;
    }
  }
  err_throw(0x7df);
}

Assistant:

int CVmObjList::getp_remove_range(VMG_ vm_val_t *retval,
                                  const vm_val_t *self_val,
                                  const char *lst, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve the starting and ending index values */
    int start_idx = CVmBif::pop_int_val(vmg0_);
    int end_idx = CVmBif::pop_int_val(vmg0_);

    /* negative index values count from the end of the list */
    if (start_idx < 0)
        start_idx += vmb_get_len(lst) + 1;
    if (end_idx < 0)
        end_idx += vmb_get_len(lst) + 1;

    /* adjust to zero-based indexing */
    --start_idx;
    --end_idx;

    /* 
     *   make sure the index values are in range - both must refer to valid
     *   elements, and the ending index must be at least as high as the
     *   starting index 
     */
    if (start_idx < 0 || (size_t)start_idx >= vmb_get_len(lst)
          || end_idx < 0 || (size_t)end_idx >= vmb_get_len(lst)
          || end_idx < start_idx)
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* remove the specified elements */
    remove_range(vmg_ retval, self_val, lst, start_idx,
                 end_idx - start_idx + 1);

    /* handled */
    return TRUE;
}